

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall args::NamedBase::~NamedBase(NamedBase *this)

{
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__NamedBase_0012cb10;
  std::__cxx11::string::~string((string *)&this->name);
  Base::~Base(&this->super_Base);
  return;
}

Assistant:

virtual ~NamedBase() {}